

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::IssueMessage(cmMakefile *this,MessageType t,string *text,bool force)

{
  string *source;
  pointer ppcVar1;
  cmake *this_00;
  bool bVar2;
  cmOutputConverter converter;
  cmListFileContext lfc;
  string local_50;
  
  ppcVar1 = (this->ExecutionStatusStack).
            super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((this->ExecutionStatusStack).
      super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
      super__Vector_impl_data._M_start == ppcVar1) {
    lfc.Name._M_dataplus._M_p = (pointer)&lfc.Name.field_2;
    lfc.Name._M_string_length = 0;
    lfc.Name.field_2._M_local_buf[0] = '\0';
    lfc.FilePath._M_dataplus._M_p = (pointer)&lfc.FilePath.field_2;
    lfc.FilePath._M_string_length = 0;
    lfc.FilePath.field_2._M_local_buf[0] = '\0';
    lfc.Line = 0;
    GetExecutionFilePath_abi_cxx11_((string *)&converter,this);
    source = &lfc.FilePath;
    std::__cxx11::string::operator=((string *)source,(string *)&converter);
    std::__cxx11::string::~string((string *)&converter);
    bVar2 = cmake::GetIsInTryCompile(this->GlobalGenerator->CMakeInstance);
    if (!bVar2) {
      cmOutputConverter::cmOutputConverter(&converter,this->StateSnapshot);
      cmOutputConverter::Convert(&local_50,&converter,source,HOME,UNCHANGED);
      std::__cxx11::string::operator=((string *)source,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    lfc.Line = 0;
    cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,t,text,&lfc,force);
    cmListFileContext::~cmListFileContext(&lfc);
  }
  else {
    if ((t & ~AUTHOR_ERROR) == FATAL_ERROR) {
      ppcVar1[-1]->NestedError = true;
    }
    this_00 = this->GlobalGenerator->CMakeInstance;
    GetBacktrace((cmListFileBacktrace *)&lfc,this);
    cmake::IssueMessage(this_00,t,text,(cmListFileBacktrace *)&lfc,force);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&lfc);
  }
  return;
}

Assistant:

void cmMakefile::IssueMessage(cmake::MessageType t,
                              std::string const& text,
                              bool force) const
{
  // Collect context information.
  if(!this->ExecutionStatusStack.empty())
    {
    if((t == cmake::FATAL_ERROR) || (t == cmake::INTERNAL_ERROR))
      {
      this->ExecutionStatusStack.back()->SetNestedError(true);
      }
    this->GetCMakeInstance()->IssueMessage(t, text, this->GetBacktrace(),
                                           force);
    }
  else
    {
    cmListFileContext lfc;
    // We are not currently executing a command.  Add whatever context
    // information we have.
    lfc.FilePath = this->GetExecutionFilePath();

    if(!this->GetCMakeInstance()->GetIsInTryCompile())
      {
      cmOutputConverter converter(this->StateSnapshot);
      lfc.FilePath = converter.Convert(lfc.FilePath, cmOutputConverter::HOME);
      }
    lfc.Line = 0;
    this->GetCMakeInstance()->IssueMessage(t, text, lfc, force);
    }
}